

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

void __thiscall CEPlanet::CEPlanet(CEPlanet *this,CEPlanet *other)

{
  allocator local_41;
  string local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  CEBody::CEBody(&this->super_CEBody,&other->super_CEBody,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_41);
  (this->super_CEBody).super_CESkyCoord._vptr_CESkyCoord = (_func_int **)&PTR__CEPlanet_00165b30;
  std::vector<double,_std::allocator<double>_>::vector(&this->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::vector(&this->vel_icrs_);
  this->E_tol = 1e-06;
  init_members(this);
  copy_members(this,other);
  return;
}

Assistant:

CEPlanet::CEPlanet(const CEPlanet& other) :
    CEBody(other)
{
    init_members();
    copy_members(other);
}